

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall Imf_2_5::DwaCompressor::initializeDefaultChannelRules(DwaCompressor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *this_00;
  Classifier local_238;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  long *local_188;
  long local_180;
  long local_178 [2];
  long *local_168;
  long local_160;
  long local_158 [2];
  long *local_148;
  long local_140;
  long local_138 [2];
  long *local_128;
  long local_120;
  long local_118 [2];
  long *local_108;
  long local_100;
  long local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  this_00 = &this->_channelRules;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  _M_erase_at_end(this_00,(this->_channelRules).
                          super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"R","");
  paVar1 = &local_238._suffix.field_2;
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_48,local_40 + (long)local_48)
  ;
  local_238._scheme = LOSSY_DCT;
  local_238._type = HALF;
  local_238._cscIdx = 0;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"R","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_68,local_60 + (long)local_68)
  ;
  local_238._scheme = LOSSY_DCT;
  local_238._type = FLOAT;
  local_238._cscIdx = 0;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"G","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_88,local_80 + (long)local_88)
  ;
  local_238._scheme = LOSSY_DCT;
  local_238._type = HALF;
  local_238._cscIdx = 1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"G","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_a8,local_a0 + (long)local_a8)
  ;
  local_238._scheme = LOSSY_DCT;
  local_238._type = FLOAT;
  local_238._cscIdx = 1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"B","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_c8,local_c0 + (long)local_c8)
  ;
  local_238._scheme = LOSSY_DCT;
  local_238._type = HALF;
  local_238._cscIdx = 2;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"B","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_e8,local_e0 + (long)local_e8)
  ;
  local_238._scheme = LOSSY_DCT;
  local_238._type = FLOAT;
  local_238._cscIdx = 2;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Y","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_108,local_100 + (long)local_108);
  local_238._scheme = LOSSY_DCT;
  local_238._type = HALF;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Y","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_128,local_120 + (long)local_128);
  local_238._scheme = LOSSY_DCT;
  local_238._type = FLOAT;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BY","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_148,local_140 + (long)local_148);
  local_238._scheme = LOSSY_DCT;
  local_238._type = HALF;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"BY","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_168,local_160 + (long)local_168);
  local_238._scheme = LOSSY_DCT;
  local_238._type = FLOAT;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"RY","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_188,local_180 + (long)local_188);
  local_238._scheme = LOSSY_DCT;
  local_238._type = HALF;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_188 != local_178) {
    operator_delete(local_188,local_178[0] + 1);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"RY","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_1a8,local_1a0 + (long)local_1a8);
  local_238._scheme = LOSSY_DCT;
  local_238._type = FLOAT;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"A","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_1c8,local_1c0 + (long)local_1c8);
  local_238._scheme = RLE;
  local_238._type = UINT;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"A","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_1e8,local_1e0 + (long)local_1e8);
  local_238._scheme = RLE;
  local_238._type = HALF;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"A","");
  local_238._suffix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_208,local_200 + (long)local_208);
  local_238._scheme = RLE;
  local_238._type = FLOAT;
  local_238._cscIdx = -1;
  local_238._caseInsensitive = false;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._suffix._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._suffix._M_dataplus._M_p,
                    local_238._suffix.field_2._M_allocated_capacity + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  return;
}

Assistant:

void
DwaCompressor::initializeDefaultChannelRules ()
{
    _channelRules.clear();

    _channelRules.push_back (Classifier ("R",     LOSSY_DCT, HALF,   0, false));
    _channelRules.push_back (Classifier ("R",     LOSSY_DCT, FLOAT,  0, false));
    _channelRules.push_back (Classifier ("G",     LOSSY_DCT, HALF,   1, false));
    _channelRules.push_back (Classifier ("G",     LOSSY_DCT, FLOAT,  1, false));
    _channelRules.push_back (Classifier ("B",     LOSSY_DCT, HALF,   2, false));
    _channelRules.push_back (Classifier ("B",     LOSSY_DCT, FLOAT,  2, false));

    _channelRules.push_back (Classifier ("Y",     LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("Y",     LOSSY_DCT, FLOAT, -1, false));
    _channelRules.push_back (Classifier ("BY",    LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("BY",    LOSSY_DCT, FLOAT, -1, false));
    _channelRules.push_back (Classifier ("RY",    LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("RY",    LOSSY_DCT, FLOAT, -1, false));

    _channelRules.push_back (Classifier ("A",     RLE,       UINT,  -1, false));
    _channelRules.push_back (Classifier ("A",     RLE,       HALF,  -1, false));
    _channelRules.push_back (Classifier ("A",     RLE,       FLOAT, -1, false));
}